

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

char * __thiscall
tinyxml2::XMLElement::ParseDeep(XMLElement *this,char *p,StrPair *parentEndTag,int *curLineNumPtr)

{
  char *pcVar1;
  
  pcVar1 = XMLUtil::SkipWhiteSpace(p,curLineNumPtr);
  if (*pcVar1 == '/') {
    this->_closingType = CLOSING;
    pcVar1 = pcVar1 + 1;
  }
  pcVar1 = StrPair::ParseName(&(this->super_XMLNode)._value,pcVar1);
  if ((this->super_XMLNode)._value._start == (this->super_XMLNode)._value._end) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = ParseAttributes(this,pcVar1,curLineNumPtr);
    if (((pcVar1 != (char *)0x0) && (*pcVar1 != '\0')) && (this->_closingType == OPEN)) {
      pcVar1 = XMLNode::ParseDeep(&this->super_XMLNode,pcVar1,parentEndTag,curLineNumPtr);
      return pcVar1;
    }
  }
  return pcVar1;
}

Assistant:

char* XMLElement::ParseDeep( char* p, StrPair* parentEndTag, int* curLineNumPtr )
{
    // Read the element name.
    p = XMLUtil::SkipWhiteSpace( p, curLineNumPtr );

    // The closing element is the </element> form. It is
    // parsed just like a regular element then deleted from
    // the DOM.
    if ( *p == '/' ) {
        _closingType = CLOSING;
        ++p;
    }

    p = _value.ParseName( p );
    if ( _value.Empty() ) {
        return 0;
    }

    p = ParseAttributes( p, curLineNumPtr );
    if ( !p || !*p || _closingType != OPEN ) {
        return p;
    }

    p = XMLNode::ParseDeep( p, parentEndTag, curLineNumPtr );
    return p;
}